

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O0

void silent_dependent_async(size_t W)

{
  code *pcVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> beg;
  bool bVar2;
  byte extraout_AL;
  int iVar3;
  time_t tVar4;
  reference piVar5;
  double __x;
  ResultBuilder DOCTEST_RB;
  int *d;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_t n;
  vector<int,_std::allocator<int>_> data;
  Executor executor;
  Result *in_stack_fffffffffffffd28;
  anon_class_24_3_b5c2bc7a *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  Expression_lhs<const_bool> in_stack_fffffffffffffd40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd48;
  Enum at;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  Executor *this;
  ExpressionDecomposer local_274;
  Expression_lhs<const_bool> local_270;
  Expression_lhs<const_bool> *in_stack_fffffffffffffda8;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  Executor *in_stack_fffffffffffffe28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_190;
  int *local_188;
  anon_class_24_3_b5c2bc7a *local_180;
  int local_178 [94];
  
  this = (Executor *)0x0;
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11866e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11867b);
  local_180 = (anon_class_24_3_b5c2bc7a *)0x0;
  while( true ) {
    if ((anon_class_24_3_b5c2bc7a *)0x1869f < local_180) {
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40);
      tf::Executor::~Executor(this);
      return;
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               (size_type)in_stack_fffffffffffffd48._M_current);
    local_188 = local_178;
    local_190._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffd30,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffd28), bVar2) {
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_190);
      iVar3 = rand();
      *piVar5 = iVar3 % 1000 + -500;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_190);
    }
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
    beg._M_current._7_1_ = in_stack_fffffffffffffd57;
    beg._M_current._0_7_ = in_stack_fffffffffffffd50;
    tf::
    make_sort_task<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (beg,in_stack_fffffffffffffd48);
    at = (Enum)((ulong)in_stack_fffffffffffffd48._M_current >> 0x20);
    tf::Executor::
    silent_dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_sort_hpp:595:10),_nullptr>
              ((Executor *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               in_stack_fffffffffffffd30);
    tf::AsyncTask::~AsyncTask((AsyncTask *)0x1187ff);
    tf::Executor::wait_for_all(this);
    in_stack_fffffffffffffd28 = (Result *)0x19625a;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),at,
               (char *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,
               (char *)in_stack_fffffffffffffd30,"",(char *)this);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_274,DT_REQUIRE);
    in_stack_fffffffffffffd48._M_current = local_178;
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
    __last._M_current._4_4_ = in_stack_fffffffffffffd3c;
    __last._M_current._0_4_ = in_stack_fffffffffffffd38;
    in_stack_fffffffffffffd57 =
         std::is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                    in_stack_fffffffffffffd40,__last);
    in_stack_fffffffffffffd40 =
         doctest::detail::ExpressionDecomposer::operator<<
                   ((ExpressionDecomposer *)
                    CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                    (bool *)in_stack_fffffffffffffd30);
    local_270 = in_stack_fffffffffffffd40;
    doctest::detail::Expression_lhs::operator_cast_to_Result(in_stack_fffffffffffffda8);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    doctest::detail::Result::~Result((Result *)0x1188e9);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffdb8,__x);
    in_stack_fffffffffffffd3c = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffd3c);
    if ((extraout_AL & 1) != 0) break;
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffd30);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1189b3);
    if (local_180 == (anon_class_24_3_b5c2bc7a *)0x0) {
      in_stack_fffffffffffffd30 = (anon_class_24_3_b5c2bc7a *)0x1;
      local_180 = in_stack_fffffffffffffd30;
    }
    else {
      in_stack_fffffffffffffd30 = (anon_class_24_3_b5c2bc7a *)((long)local_180 * 10);
      local_180 = in_stack_fffffffffffffd30;
    }
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void silent_dependent_async(size_t W) {

  std::srand(static_cast<unsigned int>(time(NULL)));
  
  tf::Executor executor(W);
  std::vector<int> data;

  for(size_t n=0; n < 100000; n = (n ? n*10 : 1)) {
    
    data.resize(n);

    for(auto& d : data) {
      d = ::rand() % 1000 - 500;
    }
  
    executor.silent_dependent_async(tf::make_sort_task(data.begin(), data.end()));
    executor.wait_for_all();
    REQUIRE(std::is_sorted(data.begin(), data.end()));
  }
}